

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCec.c
# Opt level: O1

int Fra_FraigCec(Aig_Man_t **ppAig,int nConfLimit,int fVerbose)

{
  int iVar1;
  int iVar2;
  void *__s;
  Aig_Man_t *p;
  Aig_Man_t *pAVar3;
  Aig_Man_t *p_00;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  size_t __size;
  timespec ts_4;
  Fra_Par_t Params;
  
  pAVar3 = *ppAig;
  if (fVerbose != 0) {
    printf("Original miter:   Nodes = %6d.\n");
  }
  iVar1 = Fra_FraigMiterStatus(pAVar3);
  if (iVar1 == 0) {
    __size = (long)pAVar3->nObjs[2] << 2;
    __s = malloc(__size);
    pAVar3->pData = __s;
    iVar1 = 0;
    memset(__s,0,__size);
  }
  else {
    iVar1 = clock_gettime(3,(timespec *)&Params);
    if (iVar1 < 0) {
      lVar4 = 1;
    }
    else {
      lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)Params.dSimSatur),8);
      lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + Params._0_8_ * -1000000;
    }
    iVar1 = Fra_FraigSat(pAVar3,600,0,0,0,0,1,0,0,0);
    if (fVerbose != 0) {
      iVar2 = 0x95fa0a;
      printf("Initial SAT:      Nodes = %6d.  ",(ulong)(uint)(pAVar3->nObjs[6] + pAVar3->nObjs[5]));
      Abc_Print(iVar2,"%s =","Time");
      iVar6 = 3;
      iVar2 = clock_gettime(3,(timespec *)&Params);
      if (iVar2 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = (long)Params.dSimSatur / 1000 + Params._0_8_ * 1000000;
      }
      Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
    }
    if (iVar1 < 0) {
      iVar1 = clock_gettime(3,(timespec *)&Params);
      if (iVar1 < 0) {
        lVar4 = 1;
      }
      else {
        lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)Params.dSimSatur),8);
        lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + Params._0_8_ * -1000000;
      }
      uVar8 = 1;
      p = Dar_ManRwsat(pAVar3,1,0);
      Aig_ManStop(pAVar3);
      if (fVerbose != 0) {
        iVar1 = 0x95fa2b;
        printf("Rewriting:        Nodes = %6d.  ",(ulong)(uint)(p->nObjs[6] + p->nObjs[5]));
        Abc_Print(iVar1,"%s =","Time");
        iVar2 = 3;
        iVar1 = clock_gettime(3,(timespec *)&Params);
        if (iVar1 < 0) {
          lVar5 = -1;
        }
        else {
          lVar5 = (long)Params.dSimSatur / 1000 + Params._0_8_ * 1000000;
        }
        Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
      }
      Fra_ParamsDefault(&Params);
      Params.nBTLimitNode = 2;
      Params.nBTLimitMiter = 300;
      Params.fDontShowBar = 1;
      Params.fProve = 1;
      do {
        iVar1 = Aig_ManCountXors(p);
        pAVar3 = p;
        if (p->nObjs[5] + p->nObjs[6] + 300 < iVar1 * 0x1e) {
          iVar1 = clock_gettime(3,(timespec *)&ts_4);
          if (iVar1 < 0) {
            lVar4 = 1;
          }
          else {
            lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts_4.tv_nsec),8);
            lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + ts_4.tv_sec * -1000000;
          }
          pAVar3 = Dar_ManBalanceXor(p,1,0,0);
          Aig_ManStop(p);
          if (fVerbose != 0) {
            iVar1 = 0x95fa4c;
            printf("Balance-X:        Nodes = %6d.  ",
                   (ulong)(uint)(pAVar3->nObjs[6] + pAVar3->nObjs[5]));
            Abc_Print(iVar1,"%s =","Time");
            iVar2 = 3;
            iVar1 = clock_gettime(3,(timespec *)&ts_4);
            if (iVar1 < 0) {
              lVar5 = -1;
            }
            else {
              lVar5 = ts_4.tv_nsec / 1000 + ts_4.tv_sec * 1000000;
            }
            Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
          }
        }
        iVar1 = clock_gettime(3,(timespec *)&ts_4);
        if (iVar1 < 0) {
          lVar4 = 1;
        }
        else {
          lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts_4.tv_nsec),8);
          lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + ts_4.tv_sec * -1000000;
        }
        p_00 = Fra_FraigPerform(pAVar3,&Params);
        Aig_ManStop(pAVar3);
        if (fVerbose != 0) {
          iVar1 = 0x95fa6d;
          printf("Fraiging (i=%d):   Nodes = %6d.  ",uVar8,
                 (ulong)(uint)(p_00->nObjs[6] + p_00->nObjs[5]));
          Abc_Print(iVar1,"%s =","Time");
          iVar2 = 3;
          iVar1 = clock_gettime(3,(timespec *)&ts_4);
          if (iVar1 < 0) {
            lVar5 = -1;
          }
          else {
            lVar5 = ts_4.tv_nsec / 1000 + ts_4.tv_sec * 1000000;
          }
          Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
        }
        iVar1 = Fra_FraigMiterStatus(p_00);
        p = p_00;
        if (-1 < iVar1) break;
        iVar1 = clock_gettime(3,(timespec *)&ts_4);
        if (iVar1 < 0) {
          lVar4 = 1;
        }
        else {
          lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts_4.tv_nsec),8);
          lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + ts_4.tv_sec * -1000000;
        }
        p = Dar_ManRewriteDefault(p_00);
        Aig_ManStop(p_00);
        if (fVerbose != 0) {
          iVar1 = 0x95fa2b;
          printf("Rewriting:        Nodes = %6d.  ",(ulong)(uint)(p->nObjs[6] + p->nObjs[5]));
          Abc_Print(iVar1,"%s =","Time");
          iVar2 = 3;
          iVar1 = clock_gettime(3,(timespec *)&ts_4);
          if (iVar1 < 0) {
            lVar5 = -1;
          }
          else {
            lVar5 = ts_4.tv_nsec / 1000 + ts_4.tv_sec * 1000000;
          }
          Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
        }
        iVar1 = Fra_FraigMiterStatus(p);
        if (-1 < iVar1) break;
        Params.nBTLimitMiter = Params.nBTLimitMiter << 1;
        Params.nBTLimitNode = Params.nBTLimitNode << 3;
        uVar7 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar7;
      } while (uVar7 != 7);
      if (iVar1 == -1) {
        iVar1 = clock_gettime(3,(timespec *)&ts_4);
        if (iVar1 < 0) {
          lVar4 = 1;
        }
        else {
          lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts_4.tv_nsec),8);
          lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + ts_4.tv_sec * -1000000;
        }
        iVar1 = Fra_FraigSat(p,(long)nConfLimit,0,0,0,0,1,0,0,0);
        if (fVerbose != 0) {
          iVar2 = 0x95fa8f;
          printf("Final SAT:        Nodes = %6d.  ",(ulong)(uint)(p->nObjs[6] + p->nObjs[5]));
          Abc_Print(iVar2,"%s =","Time");
          iVar6 = 3;
          iVar2 = clock_gettime(3,(timespec *)&ts_4);
          if (iVar2 < 0) {
            lVar5 = -1;
          }
          else {
            lVar5 = ts_4.tv_nsec / 1000 + ts_4.tv_sec * 1000000;
          }
          Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
        }
      }
      *ppAig = p;
    }
  }
  return iVar1;
}

Assistant:

int Fra_FraigCec( Aig_Man_t ** ppAig, int nConfLimit, int fVerbose )
{
    int nBTLimitStart =        300;   // starting SAT run
    int nBTLimitFirst =          2;   // first fraiging iteration
    int nBTLimitLast  = nConfLimit;   // the last-gasp SAT run

    Fra_Par_t Params, * pParams = &Params;
    Aig_Man_t * pAig = *ppAig, * pTemp;
    int i, RetValue;
    abctime clk;

    // report the original miter
    if ( fVerbose )
    {
        printf( "Original miter:   Nodes = %6d.\n", Aig_ManNodeNum(pAig) );
    }
    RetValue = Fra_FraigMiterStatus( pAig );
//    assert( RetValue == -1 );
    if ( RetValue == 0 )
    {
        pAig->pData = ABC_ALLOC( int, Aig_ManCiNum(pAig) );
        memset( pAig->pData, 0, sizeof(int) * Aig_ManCiNum(pAig) );
        return RetValue;
    }

    // if SAT only, solve without iteration
clk = Abc_Clock();
    RetValue = Fra_FraigSat( pAig, (ABC_INT64_T)2*nBTLimitStart, (ABC_INT64_T)0, 0, 0, 0, 1, 0, 0, 0 );
    if ( fVerbose )
    {
        printf( "Initial SAT:      Nodes = %6d.  ", Aig_ManNodeNum(pAig) );
ABC_PRT( "Time", Abc_Clock() - clk );
    }
    if ( RetValue >= 0 )
        return RetValue;

    // duplicate the AIG
clk = Abc_Clock();
    pAig = Dar_ManRwsat( pTemp = pAig, 1, 0 );
    Aig_ManStop( pTemp );
    if ( fVerbose )
    {
        printf( "Rewriting:        Nodes = %6d.  ", Aig_ManNodeNum(pAig) );
ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // perform the loop
    Fra_ParamsDefault( pParams );
    pParams->nBTLimitNode = nBTLimitFirst;
    pParams->nBTLimitMiter = nBTLimitStart;
    pParams->fDontShowBar = 1;
    pParams->fProve = 1;
    for ( i = 0; i < 6; i++ )
    {
//printf( "Running fraiging with %d BTnode and %d BTmiter.\n", pParams->nBTLimitNode, pParams->nBTLimitMiter );
        // try XOR balancing
        if ( Aig_ManCountXors(pAig) * 30 > Aig_ManNodeNum(pAig) + 300 )
        {
clk = Abc_Clock();
            pAig = Dar_ManBalanceXor( pTemp = pAig, 1, 0, 0 );
            Aig_ManStop( pTemp );
            if ( fVerbose )
            {
                printf( "Balance-X:        Nodes = %6d.  ", Aig_ManNodeNum(pAig) );
ABC_PRT( "Time", Abc_Clock() - clk );
            } 
        }

        // run fraiging
clk = Abc_Clock();
        pAig = Fra_FraigPerform( pTemp = pAig, pParams );
        Aig_ManStop( pTemp );
        if ( fVerbose )
        {
            printf( "Fraiging (i=%d):   Nodes = %6d.  ", i+1, Aig_ManNodeNum(pAig) );
ABC_PRT( "Time", Abc_Clock() - clk );
        }

        // check the miter status
        RetValue = Fra_FraigMiterStatus( pAig );
        if ( RetValue >= 0 )
            break;

        // perform rewriting
clk = Abc_Clock();
        pAig = Dar_ManRewriteDefault( pTemp = pAig );
        Aig_ManStop( pTemp );
        if ( fVerbose )
        {
            printf( "Rewriting:        Nodes = %6d.  ", Aig_ManNodeNum(pAig) );
ABC_PRT( "Time", Abc_Clock() - clk );
        } 

        // check the miter status
        RetValue = Fra_FraigMiterStatus( pAig );
        if ( RetValue >= 0 )
            break;
        // try simulation

        // set the parameters for the next run
        pParams->nBTLimitNode = 8 * pParams->nBTLimitNode;
        pParams->nBTLimitMiter = 2 * pParams->nBTLimitMiter;
    }

    // if still unsolved try last gasp
    if ( RetValue == -1 )
    {
clk = Abc_Clock();
        RetValue = Fra_FraigSat( pAig, (ABC_INT64_T)nBTLimitLast, (ABC_INT64_T)0, 0, 0, 0, 1, 0, 0, 0 );
        if ( fVerbose )
        {
            printf( "Final SAT:        Nodes = %6d.  ", Aig_ManNodeNum(pAig) );
ABC_PRT( "Time", Abc_Clock() - clk );
        }
    }

    *ppAig = pAig;
    return RetValue;
}